

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O1

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
 __thiscall
draco::MeshPredictionSchemeDecoderFactory<int>::
DispatchFunctor<draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>,_(draco::PredictionSchemeTransformType)3>
::operator()(DispatchFunctor<draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>,_(draco::PredictionSchemeTransformType)3>
             *this,PredictionSchemeMethod method,PointAttribute *attribute,
            PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *transform,
            MeshPredictionSchemeData<draco::CornerTable> *mesh_data,uint16_t bitstream_version)

{
  undefined8 *puVar1;
  CornerTable *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  undefined6 in_register_0000008a;
  
  if ((int)attribute == 6) {
    puVar1 = (undefined8 *)CONCAT62(in_register_0000008a,bitstream_version);
    puVar6 = (undefined8 *)operator_new(0xb8);
    *puVar6 = &PTR__PredictionSchemeInterface_00185748;
    puVar6[1] = transform;
    pCVar2 = mesh_data->corner_table_;
    puVar6[2] = mesh_data->mesh_;
    puVar6[3] = pCVar2;
    *(undefined4 *)(puVar6 + 4) = *(undefined4 *)&mesh_data->vertex_to_data_map_;
    *puVar6 = &PTR__PredictionSchemeInterface_001858f0;
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    uVar5 = puVar1[3];
    puVar6[7] = puVar1[2];
    puVar6[8] = uVar5;
    puVar6[5] = uVar3;
    puVar6[6] = uVar4;
    *puVar6 = &PTR__MeshPredictionSchemeGeometricNormalDecoder_00185850;
    puVar6[9] = &PTR__MeshPredictionSchemeGeometricNormalPredictorBase_001859c0;
    puVar6[10] = 0;
    puVar6[0xb] = 0;
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    uVar5 = puVar1[3];
    puVar6[0xe] = puVar1[2];
    puVar6[0xf] = uVar5;
    puVar6[0xc] = uVar3;
    puVar6[0xd] = uVar4;
    puVar6[9] = &PTR__MeshPredictionSchemeGeometricNormalPredictorBase_00185960;
    *(undefined4 *)(puVar6 + 0x10) = 1;
    puVar6[0x11] = 0xffffffffffffffff;
    puVar6[0x12] = 0x3f800000ffffffff;
    *(undefined4 *)(puVar6 + 0x13) = 0xffffffff;
    RAnsBitDecoder::RAnsBitDecoder((RAnsBitDecoder *)(puVar6 + 0x14));
  }
  else {
    *(undefined8 *)this = 0;
    puVar6 = (undefined8 *)0x0;
  }
  *(undefined8 **)this = puVar6;
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>> operator()(
        PredictionSchemeMethod method, const PointAttribute *attribute,
        const TransformT &transform, const MeshDataT &mesh_data,
        uint16_t bitstream_version) {
      if (method == MESH_PREDICTION_GEOMETRIC_NORMAL) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeGeometricNormalDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
      return nullptr;
    }